

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf_tempo.c
# Opt level: O2

void maybe_add_to_tempo_map(smf_event_t *event)

{
  byte bVar1;
  ushort uVar2;
  smf_t *smf;
  uchar *puVar3;
  int iVar4;
  smf_tempo_t *psVar5;
  char *pcVar6;
  uint uVar7;
  double dVar8;
  ulong uVar9;
  
  iVar4 = smf_event_is_metadata(event);
  if (iVar4 != 0) {
    if (event->track == (smf_track_t *)0x0) {
      __assert_fail("event->track != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                    ,0x82,"void maybe_add_to_tempo_map(smf_event_t *)");
    }
    smf = event->track->smf;
    if (smf == (smf_t *)0x0) {
      __assert_fail("event->track->smf != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                    ,0x83,"void maybe_add_to_tempo_map(smf_event_t *)");
    }
    if (event->midi_buffer_length < 1) {
      __assert_fail("event->midi_buffer_length >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf_tempo.c"
                    ,0x84,"void maybe_add_to_tempo_map(smf_event_t *)");
    }
    puVar3 = event->midi_buffer;
    if (puVar3[1] == 'Q') {
      uVar7 = (uint)puVar3[5] | (uint)puVar3[4] << 8 | (uint)puVar3[3] << 0x10;
      if (uVar7 == 0) {
        pcVar6 = "Ignoring invalid tempo change.";
        goto LAB_0010eabc;
      }
      psVar5 = new_tempo(smf,event->time_pulses);
      if (psVar5 != (smf_tempo_t *)0x0) {
        psVar5->microseconds_per_quarter_note = uVar7;
      }
    }
    puVar3 = event->midi_buffer;
    if (puVar3[1] == 'X') {
      if (event->midi_buffer_length < 7) {
        pcVar6 = "Time Signature event seems truncated.";
LAB_0010eabc:
        g_log("libsmf",8,pcVar6);
        return;
      }
      bVar1 = puVar3[3];
      dVar8 = ldexp(1.0,(uint)puVar3[4]);
      uVar2 = *(ushort *)(event->midi_buffer + 5);
      psVar5 = new_tempo(event->track->smf,event->time_pulses);
      if (psVar5 != (smf_tempo_t *)0x0) {
        psVar5->numerator = (uint)bVar1;
        psVar5->denominator = (int)dVar8;
        uVar9 = (ulong)CONCAT14((char)(uVar2 >> 8),(uint)(uVar2 & 0xff));
        psVar5->clocks_per_click = (int)uVar9;
        psVar5->notes_per_note = (int)(uVar9 >> 0x20);
      }
    }
  }
  return;
}

Assistant:

void
maybe_add_to_tempo_map(smf_event_t *event)
{
	if (!smf_event_is_metadata(event))
		return;

	assert(event->track != NULL);
	assert(event->track->smf != NULL);
	assert(event->midi_buffer_length >= 1);

	/* Tempo Change? */
	if (event->midi_buffer[1] == 0x51) {
		int new_tempo = (event->midi_buffer[3] << 16) + (event->midi_buffer[4] << 8) + event->midi_buffer[5];
		if (new_tempo <= 0) {
			g_critical("Ignoring invalid tempo change.");
			return;
		}

		add_tempo(event->track->smf, event->time_pulses, new_tempo);
	}

	/* Time Signature? */
	if (event->midi_buffer[1] == 0x58) {
		int numerator, denominator, clocks_per_click, notes_per_note;

		if (event->midi_buffer_length < 7) {
			g_critical("Time Signature event seems truncated.");
			return;
		}

		numerator = event->midi_buffer[3];
		denominator = (int)pow(2, event->midi_buffer[4]);
		clocks_per_click = event->midi_buffer[5];
		notes_per_note = event->midi_buffer[6];

		add_time_signature(event->track->smf, event->time_pulses, numerator, denominator, clocks_per_click, notes_per_note);
	}

	return;
}